

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs-copyfile.c
# Opt level: O1

void touch_file(char *name)

{
  char *__s;
  size_t sVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined1 *puVar7;
  undefined1 *puVar8;
  uv_fs_event_t *puVar9;
  uv_fs_event_t *puVar10;
  size_t sVar11;
  int extraout_EDX;
  ulong unaff_RBX;
  long lVar12;
  code *__s1;
  undefined1 *unaff_R14;
  uv_fs_t req;
  size_t sStack_848;
  char acStack_840 [1032];
  uv_fs_event_t *puStack_438;
  uv_fs_event_t uStack_3f8;
  uv_fs_event_t uStack_370;
  undefined8 uStack_2e8;
  code *pcStack_2e0;
  code *pcStack_2d8;
  code *pcStack_2d0;
  code *pcStack_2c8;
  undefined1 *puStack_2b8;
  code *pcStack_2b0;
  undefined1 auStack_2a0 [152];
  code *pcStack_208;
  ulong uStack_1f8;
  code *pcStack_1f0;
  undefined8 local_1e8;
  undefined1 local_1d8 [16];
  undefined1 local_1c8 [440];
  
  iVar4 = 2;
  pcStack_1f0 = (code *)0x159de4;
  uVar2 = uv_fs_open(0,local_1c8,name,2,0,0);
  if ((int)uVar2 < 0) {
    pcStack_1f0 = (code *)0x159e76;
    touch_file_cold_1();
LAB_00159e76:
    pcStack_1f0 = (code *)0x159e7b;
    touch_file_cold_2();
  }
  else {
    unaff_RBX = (ulong)uVar2;
    unaff_R14 = local_1c8;
    pcStack_1f0 = (code *)0x159dfb;
    uv_fs_req_cleanup(unaff_R14);
    pcStack_1f0 = (code *)0x159e0c;
    local_1d8 = uv_buf_init("foo",4);
    puVar8 = local_1d8;
    local_1e8 = 0;
    pcStack_1f0 = (code *)0x159e39;
    iVar3 = uv_fs_write(0,unaff_R14,unaff_RBX,puVar8,1,0xffffffffffffffff);
    iVar4 = (int)puVar8;
    if (iVar3 < 0) goto LAB_00159e76;
    unaff_R14 = local_1c8;
    pcStack_1f0 = (code *)0x159e4a;
    uv_fs_req_cleanup(unaff_R14);
    iVar4 = 0;
    pcStack_1f0 = (code *)0x159e58;
    iVar3 = uv_fs_close(0,unaff_R14,uVar2);
    if (iVar3 == 0) {
      pcStack_1f0 = (code *)0x159e66;
      uv_fs_req_cleanup(local_1c8);
      return;
    }
  }
  pcStack_1f0 = run_test_fs_event_no_callback_on_close;
  touch_file_cold_3();
  pcStack_208 = (code *)0x159e89;
  uStack_1f8 = unaff_RBX;
  pcStack_1f0 = (code *)unaff_R14;
  uVar5 = uv_default_loop();
  pcStack_208 = (code *)0x159e9b;
  remove("watch_dir/file1");
  pcStack_208 = (code *)0x159ea7;
  remove("watch_dir/");
  pcStack_208 = (code *)0x159eb3;
  create_dir("watch_dir");
  pcStack_208 = (code *)0x159ebb;
  create_file("watch_dir/file1");
  pcStack_208 = (code *)0x159eca;
  iVar3 = uv_fs_event_init(uVar5,&fs_event);
  if (iVar3 == 0) {
    iVar4 = 0;
    pcStack_208 = (code *)0x159eee;
    iVar3 = uv_fs_event_start(&fs_event,fs_event_cb_file,"watch_dir/file1");
    if (iVar3 != 0) goto LAB_00159f85;
    pcStack_208 = (code *)0x159f09;
    uv_close(&fs_event,close_cb);
    pcStack_208 = (code *)0x159f13;
    uv_run(uVar5,0);
    if (fs_event_cb_called != 0) goto LAB_00159f8a;
    if (close_cb_called != 1) goto LAB_00159f8f;
    pcStack_208 = (code *)0x159f31;
    remove("watch_dir/file1");
    pcStack_208 = (code *)0x159f3d;
    remove("watch_dir/");
    pcStack_208 = (code *)0x159f42;
    uVar5 = uv_default_loop();
    pcStack_208 = (code *)0x159f56;
    uv_walk(uVar5,close_walk_cb,0);
    pcStack_208 = (code *)0x159f60;
    uv_run(uVar5,0);
    pcStack_208 = (code *)0x159f65;
    uVar6 = uv_default_loop();
    pcStack_208 = (code *)0x159f6d;
    iVar3 = uv_loop_close(uVar6);
    if (iVar3 == 0) {
      pcStack_208 = (code *)0x159f76;
      uv_library_shutdown();
      return;
    }
  }
  else {
    pcStack_208 = (code *)0x159f85;
    run_test_fs_event_no_callback_on_close_cold_1();
LAB_00159f85:
    pcStack_208 = (code *)0x159f8a;
    run_test_fs_event_no_callback_on_close_cold_2();
LAB_00159f8a:
    pcStack_208 = (code *)0x159f8f;
    run_test_fs_event_no_callback_on_close_cold_3();
LAB_00159f8f:
    pcStack_208 = (code *)0x159f94;
    run_test_fs_event_no_callback_on_close_cold_4();
  }
  pcStack_208 = run_test_fs_event_immediate_close;
  run_test_fs_event_no_callback_on_close_cold_5();
  pcStack_2b0 = (code *)0x159fa6;
  pcStack_208 = (code *)uVar5;
  puVar7 = (undefined1 *)uv_default_loop();
  pcStack_2b0 = (code *)0x159fb6;
  puVar8 = puVar7;
  iVar3 = uv_timer_init(puVar7,auStack_2a0);
  if (iVar3 == 0) {
    puVar8 = auStack_2a0;
    iVar4 = 0;
    pcStack_2b0 = (code *)0x159fd2;
    iVar3 = uv_timer_start(puVar8,timer_cb,1);
    if (iVar3 != 0) goto LAB_0015a032;
    pcStack_2b0 = (code *)0x159fe0;
    puVar8 = puVar7;
    uv_run(puVar7,0);
    if (close_cb_called != 2) goto LAB_0015a037;
    pcStack_2b0 = (code *)0x159fee;
    puVar7 = (undefined1 *)uv_default_loop();
    pcStack_2b0 = (code *)0x15a002;
    uv_walk(puVar7,close_walk_cb,0);
    pcStack_2b0 = (code *)0x15a00c;
    uv_run(puVar7,0);
    pcStack_2b0 = (code *)0x15a011;
    puVar8 = (undefined1 *)uv_default_loop();
    pcStack_2b0 = (code *)0x15a019;
    iVar3 = uv_loop_close();
    if (iVar3 == 0) {
      pcStack_2b0 = (code *)0x15a022;
      uv_library_shutdown();
      return;
    }
  }
  else {
    pcStack_2b0 = (code *)0x15a032;
    run_test_fs_event_immediate_close_cold_1();
LAB_0015a032:
    pcStack_2b0 = (code *)0x15a037;
    run_test_fs_event_immediate_close_cold_2();
LAB_0015a037:
    pcStack_2b0 = (code *)0x15a03c;
    run_test_fs_event_immediate_close_cold_3();
  }
  pcStack_2b0 = timer_cb;
  run_test_fs_event_immediate_close_cold_4();
  pcStack_2b0 = (code *)0x1920ee;
  pcStack_2c8 = (code *)0x15a058;
  puStack_2b8 = puVar7;
  iVar3 = uv_fs_event_init(*(undefined8 *)(puVar8 + 8),&fs_event);
  if (iVar3 == 0) {
    iVar4 = 0;
    pcStack_2c8 = (code *)0x15a078;
    iVar3 = uv_fs_event_start(&fs_event,fs_event_fail,".");
    if (iVar3 == 0) {
      pcStack_2c8 = (code *)0x15a092;
      uv_close(&fs_event,close_cb);
      uv_close(puVar8,close_cb);
      return;
    }
  }
  else {
    pcStack_2c8 = (code *)0x15a0a9;
    timer_cb_cold_1();
  }
  pcStack_2c8 = run_test_fs_event_close_with_pending_event;
  timer_cb_cold_2();
  pcStack_2d0 = (code *)0x15a0b4;
  pcStack_2c8 = (code *)puVar8;
  uVar5 = uv_default_loop();
  pcStack_2d0 = (code *)0x15a0c3;
  create_dir("watch_dir");
  pcStack_2d0 = (code *)0x15a0cf;
  create_file("watch_dir/file");
  pcStack_2d0 = (code *)0x15a0de;
  iVar3 = uv_fs_event_init(uVar5,&fs_event);
  if (iVar3 == 0) {
    iVar4 = 0;
    pcStack_2d0 = (code *)0x15a102;
    iVar3 = uv_fs_event_start(&fs_event,fs_event_fail,"watch_dir");
    if (iVar3 != 0) goto LAB_0015a196;
    pcStack_2d0 = (code *)0x15a116;
    touch_file("watch_dir/file");
    pcStack_2d0 = (code *)0x15a129;
    uv_close(&fs_event,close_cb);
    pcStack_2d0 = (code *)0x15a133;
    uv_run(uVar5,0);
    if (close_cb_called != 1) goto LAB_0015a19b;
    pcStack_2d0 = (code *)0x15a148;
    remove("watch_dir/file");
    pcStack_2d0 = (code *)0x15a154;
    remove("watch_dir/");
    pcStack_2d0 = (code *)0x15a159;
    uVar5 = uv_default_loop();
    pcStack_2d0 = (code *)0x15a16d;
    uv_walk(uVar5,close_walk_cb,0);
    pcStack_2d0 = (code *)0x15a177;
    uv_run(uVar5,0);
    pcStack_2d0 = (code *)0x15a17c;
    uv_default_loop();
    pcStack_2d0 = (code *)0x15a184;
    iVar3 = uv_loop_close();
    if (iVar3 == 0) {
      pcStack_2d0 = (code *)0x15a18d;
      uv_library_shutdown();
      return;
    }
  }
  else {
    pcStack_2d0 = (code *)0x15a196;
    run_test_fs_event_close_with_pending_event_cold_1();
LAB_0015a196:
    pcStack_2d0 = (code *)0x15a19b;
    run_test_fs_event_close_with_pending_event_cold_2();
LAB_0015a19b:
    pcStack_2d0 = (code *)0x15a1a0;
    run_test_fs_event_close_with_pending_event_cold_3();
  }
  pcStack_2d0 = run_test_fs_event_close_in_callback;
  run_test_fs_event_close_with_pending_event_cold_4();
  pcStack_2d8 = (code *)0x15a1ab;
  pcStack_2d0 = (code *)uVar5;
  uVar5 = uv_default_loop();
  pcStack_2d8 = (code *)0x15a1b5;
  fs_event_unlink_files((uv_timer_t *)0x0);
  pcStack_2d8 = (code *)0x15a1c1;
  create_dir("watch_dir");
  pcStack_2d8 = (code *)0x15a1d0;
  iVar3 = uv_fs_event_init(uVar5,&fs_event);
  if (iVar3 == 0) {
    iVar4 = 0;
    pcStack_2d8 = (code *)0x15a1f4;
    iVar3 = uv_fs_event_start(&fs_event,fs_event_cb_close,"watch_dir");
    if (iVar3 != 0) goto LAB_0015a2c6;
    pcStack_2d8 = (code *)0x15a20b;
    iVar3 = uv_timer_init(uVar5,&timer);
    if (iVar3 != 0) goto LAB_0015a2cb;
    iVar4 = 0;
    pcStack_2d8 = (code *)0x15a22d;
    iVar3 = uv_timer_start(&timer,fs_event_create_files,100);
    if (iVar3 != 0) goto LAB_0015a2d0;
    pcStack_2d8 = (code *)0x15a23f;
    uv_run(uVar5,0);
    pcStack_2d8 = (code *)0x15a252;
    uv_close(&timer,close_cb);
    pcStack_2d8 = (code *)0x15a25f;
    uv_run(uVar5,1);
    if (close_cb_called != 2) goto LAB_0015a2d5;
    if (fs_event_cb_called != 3) goto LAB_0015a2da;
    pcStack_2d8 = (code *)0x15a278;
    fs_event_unlink_files((uv_timer_t *)0x0);
    pcStack_2d8 = (code *)0x15a284;
    remove("watch_dir/");
    pcStack_2d8 = (code *)0x15a289;
    uVar5 = uv_default_loop();
    pcStack_2d8 = (code *)0x15a29d;
    uv_walk(uVar5,close_walk_cb,0);
    pcStack_2d8 = (code *)0x15a2a7;
    uv_run(uVar5,0);
    pcStack_2d8 = (code *)0x15a2ac;
    uVar6 = uv_default_loop();
    pcStack_2d8 = (code *)0x15a2b4;
    iVar3 = uv_loop_close(uVar6);
    if (iVar3 == 0) {
      pcStack_2d8 = (code *)0x15a2bd;
      uv_library_shutdown();
      return;
    }
  }
  else {
    pcStack_2d8 = (code *)0x15a2c6;
    run_test_fs_event_close_in_callback_cold_1();
LAB_0015a2c6:
    pcStack_2d8 = (code *)0x15a2cb;
    run_test_fs_event_close_in_callback_cold_2();
LAB_0015a2cb:
    pcStack_2d8 = (code *)0x15a2d0;
    run_test_fs_event_close_in_callback_cold_3();
LAB_0015a2d0:
    pcStack_2d8 = (code *)0x15a2d5;
    run_test_fs_event_close_in_callback_cold_4();
LAB_0015a2d5:
    pcStack_2d8 = (code *)0x15a2da;
    run_test_fs_event_close_in_callback_cold_5();
LAB_0015a2da:
    pcStack_2d8 = (code *)0x15a2df;
    run_test_fs_event_close_in_callback_cold_6();
  }
  pcStack_2d8 = fs_event_cb_close;
  run_test_fs_event_close_in_callback_cold_7();
  if (iVar4 == 0) {
    if (fs_event_cb_called < 3) {
      fs_event_cb_called = fs_event_cb_called + 1;
      if (fs_event_cb_called == 3) {
        uv_close();
        return;
      }
      return;
    }
  }
  else {
    pcStack_2e0 = (code *)0x15a315;
    fs_event_cb_close_cold_1();
  }
  pcStack_2e0 = run_test_fs_event_start_and_close;
  fs_event_cb_close_cold_2();
  pcStack_2e0 = (code *)0x1920ee;
  uStack_2e8 = uVar5;
  puVar9 = (uv_fs_event_t *)uv_default_loop();
  create_dir("watch_dir");
  __s1 = (code *)&uStack_370;
  puVar10 = puVar9;
  iVar3 = uv_fs_event_init();
  if (iVar3 == 0) {
    __s1 = fs_event_cb_dir;
    puVar10 = &uStack_370;
    iVar4 = 0;
    iVar3 = uv_fs_event_start(puVar10,fs_event_cb_dir,"watch_dir");
    if (iVar3 != 0) goto LAB_0015a43a;
    __s1 = (code *)&uStack_3f8;
    puVar10 = puVar9;
    iVar3 = uv_fs_event_init();
    if (iVar3 != 0) goto LAB_0015a43f;
    __s1 = fs_event_cb_dir;
    puVar10 = &uStack_3f8;
    iVar4 = 0;
    iVar3 = uv_fs_event_start(puVar10,fs_event_cb_dir,"watch_dir");
    if (iVar3 != 0) goto LAB_0015a444;
    uv_close(&uStack_3f8,close_cb);
    uv_close(&uStack_370);
    __s1 = (code *)0x0;
    puVar10 = puVar9;
    uv_run();
    if (close_cb_called != 2) goto LAB_0015a449;
    remove("watch_dir/");
    puVar9 = (uv_fs_event_t *)uv_default_loop();
    uv_walk(puVar9,close_walk_cb,0);
    __s1 = (code *)0x0;
    uv_run(puVar9);
    puVar10 = (uv_fs_event_t *)uv_default_loop();
    iVar3 = uv_loop_close();
    if (iVar3 == 0) {
      uv_library_shutdown();
      return;
    }
  }
  else {
    run_test_fs_event_start_and_close_cold_1();
LAB_0015a43a:
    run_test_fs_event_start_and_close_cold_2();
LAB_0015a43f:
    run_test_fs_event_start_and_close_cold_3();
LAB_0015a444:
    run_test_fs_event_start_and_close_cold_4();
LAB_0015a449:
    run_test_fs_event_start_and_close_cold_5();
  }
  run_test_fs_event_start_and_close_cold_6();
  fs_event_cb_called = fs_event_cb_called + 1;
  if (puVar10 == &fs_event) {
    if (iVar4 != 0) goto LAB_0015a4ae;
    if (extraout_EDX != 2) goto LAB_0015a4b3;
    iVar4 = strcmp((char *)__s1,"file1");
    if (iVar4 != 0) goto LAB_0015a4b8;
    iVar4 = uv_fs_event_stop(&fs_event);
    if (iVar4 == 0) {
      uv_close(&fs_event,close_cb);
      return;
    }
  }
  else {
    fs_event_cb_dir_cold_1();
LAB_0015a4ae:
    fs_event_cb_dir_cold_2();
LAB_0015a4b3:
    fs_event_cb_dir_cold_3();
LAB_0015a4b8:
    fs_event_cb_dir_cold_4();
  }
  fs_event_cb_dir_cold_5();
  puStack_438 = puVar9;
  uVar5 = uv_default_loop();
  create_dir("watch_dir");
  create_dir("watch_dir/subfolder");
  lVar12 = 0;
  do {
    iVar4 = uv_fs_event_init(uVar5,&fs_event);
    if (iVar4 != 0) {
LAB_0015a6bc:
      run_test_fs_event_getpath_cold_1();
      goto LAB_0015a6c1;
    }
    sStack_848 = 0x400;
    iVar4 = uv_fs_event_getpath(&fs_event,acStack_840,&sStack_848);
    if (iVar4 != -0x16) {
LAB_0015a6b7:
      run_test_fs_event_getpath_cold_2();
      goto LAB_0015a6bc;
    }
    __s = *(char **)((long)&DAT_001ddca0 + lVar12);
    iVar4 = uv_fs_event_start(&fs_event,fail_cb,__s,0);
    if (iVar4 != 0) {
LAB_0015a6b2:
      run_test_fs_event_getpath_cold_3();
      goto LAB_0015a6b7;
    }
    sStack_848 = 0;
    iVar4 = uv_fs_event_getpath(&fs_event,acStack_840,&sStack_848);
    sVar1 = sStack_848;
    if (iVar4 != -0x69) {
LAB_0015a6ad:
      run_test_fs_event_getpath_cold_4();
      goto LAB_0015a6b2;
    }
    if (0x3ff < sStack_848) {
LAB_0015a6a8:
      run_test_fs_event_getpath_cold_5();
      goto LAB_0015a6ad;
    }
    sVar11 = strlen(__s);
    if (sVar1 != sVar11 + 1) {
LAB_0015a6a3:
      run_test_fs_event_getpath_cold_6();
      goto LAB_0015a6a8;
    }
    iVar4 = uv_fs_event_getpath(&fs_event,acStack_840,&sStack_848);
    sVar1 = sStack_848;
    if (iVar4 != 0) {
LAB_0015a69e:
      run_test_fs_event_getpath_cold_7();
      goto LAB_0015a6a3;
    }
    sVar11 = strlen(__s);
    if (sVar1 != sVar11) {
LAB_0015a699:
      run_test_fs_event_getpath_cold_8();
      goto LAB_0015a69e;
    }
    iVar4 = strcmp(acStack_840,__s);
    if (iVar4 != 0) {
LAB_0015a694:
      run_test_fs_event_getpath_cold_9();
      goto LAB_0015a699;
    }
    iVar4 = uv_fs_event_stop(&fs_event);
    if (iVar4 != 0) {
LAB_0015a68f:
      run_test_fs_event_getpath_cold_10();
      goto LAB_0015a694;
    }
    uv_close(&fs_event,close_cb);
    uv_run(uVar5,0);
    if (close_cb_called != 1) {
      run_test_fs_event_getpath_cold_11();
      goto LAB_0015a68f;
    }
    close_cb_called = 0;
    lVar12 = lVar12 + 8;
  } while (lVar12 != 0x28);
  remove("watch_dir/");
  uVar5 = uv_default_loop();
  uv_walk(uVar5,close_walk_cb,0);
  uv_run(uVar5,0);
  uVar5 = uv_default_loop();
  iVar4 = uv_loop_close(uVar5);
  if (iVar4 == 0) {
    uv_library_shutdown();
    return;
  }
LAB_0015a6c1:
  run_test_fs_event_getpath_cold_12();
  uVar5 = uv_default_loop();
  uv_walk(uVar5,close_walk_cb,0);
  uv_run(uVar5,0);
  uVar5 = uv_default_loop();
  iVar4 = uv_loop_close(uVar5);
  if (iVar4 == 0) {
    uv_library_shutdown();
    return;
  }
  run_test_fs_event_error_reporting_cold_1();
  puVar10 = (uv_fs_event_t *)uv_default_loop();
  iVar4 = uv_fs_event_init(puVar10,&fs_event);
  if (iVar4 == 0) {
    puVar10 = &fs_event;
    iVar4 = uv_fs_event_start(&fs_event,fs_event_cb_file,"<:;",0);
    if (iVar4 == 0) goto LAB_0015a7cc;
    puVar10 = &fs_event;
    iVar4 = uv_is_active(&fs_event);
    if (iVar4 != 0) goto LAB_0015a7d1;
    puVar10 = &fs_event;
    iVar4 = uv_fs_event_start(&fs_event,fs_event_cb_file,"",0);
    if (iVar4 == 0) goto LAB_0015a7d6;
    puVar10 = &fs_event;
    iVar4 = uv_is_active(&fs_event);
    if (iVar4 == 0) {
      uVar5 = uv_default_loop();
      uv_walk(uVar5,close_walk_cb,0);
      uv_run(uVar5,0);
      puVar10 = (uv_fs_event_t *)uv_default_loop();
      iVar4 = uv_loop_close(puVar10);
      if (iVar4 == 0) {
        uv_library_shutdown();
        return;
      }
      goto LAB_0015a7e0;
    }
  }
  else {
    run_test_fs_event_watch_invalid_path_cold_1();
LAB_0015a7cc:
    run_test_fs_event_watch_invalid_path_cold_6();
LAB_0015a7d1:
    run_test_fs_event_watch_invalid_path_cold_2();
LAB_0015a7d6:
    run_test_fs_event_watch_invalid_path_cold_5();
  }
  run_test_fs_event_watch_invalid_path_cold_3();
LAB_0015a7e0:
  run_test_fs_event_watch_invalid_path_cold_4();
  iVar4 = uv_is_closing();
  if (iVar4 != 0) {
    return;
  }
  uv_close(puVar10,0);
  return;
}

Assistant:

static void touch_file(const char* name, unsigned int size) {
  uv_file file;
  uv_fs_t req;
  uv_buf_t buf;
  int r;
  unsigned int i;

  r = uv_fs_open(NULL, &req, name, O_WRONLY | O_CREAT | O_TRUNC,
                 S_IWUSR | S_IRUSR, NULL);
  uv_fs_req_cleanup(&req);
  ASSERT(r >= 0);
  file = r;

  buf = uv_buf_init("a", 1);

  /* Inefficient but simple. */
  for (i = 0; i < size; i++) {
    r = uv_fs_write(NULL, &req, file, &buf, 1, i, NULL);
    uv_fs_req_cleanup(&req);
    ASSERT(r >= 0);
  }

  r = uv_fs_close(NULL, &req, file, NULL);
  uv_fs_req_cleanup(&req);
  ASSERT(r == 0);
}